

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get_value<std::array<unsigned_int,2ul>>
          (Attribute *this,array<unsigned_int,_2UL> *v)

{
  value_type *pvVar1;
  optional<std::array<unsigned_int,_2UL>_> local_38;
  undefined1 local_2c [8];
  optional<std::array<unsigned_int,_2UL>_> ret;
  array<unsigned_int,_2UL> *v_local;
  Attribute *this_local;
  
  if (v == (array<unsigned_int,_2UL> *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    ret.contained = (storage_t<std::array<unsigned_int,_2UL>_>)v;
    primvar::PrimVar::get_value<std::array<unsigned_int,2ul>>(&local_38,&this->_var);
    nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>::
    optional<std::array<unsigned_int,_2UL>,_0>
              ((optional<std::array<unsigned_int,_2UL>_> *)local_2c,&local_38);
    nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>::~optional(&local_38);
    this_local._7_1_ = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_2c);
    if (this_local._7_1_) {
      pvVar1 = nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>::value
                         ((optional<std::array<unsigned_int,_2UL>_> *)local_2c);
      *(undefined8 *)ret.contained = *(undefined8 *)pvVar1->_M_elems;
    }
    nonstd::optional_lite::optional<std::array<unsigned_int,_2UL>_>::~optional
              ((optional<std::array<unsigned_int,_2UL>_> *)local_2c);
  }
  return this_local._7_1_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }